

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O3

void __thiscall Ptex::v2_4::PtexReader::purge(PtexReader *this)

{
  pointer pFVar1;
  pointer pFVar2;
  pointer puVar3;
  pointer puVar4;
  pointer pLVar5;
  pointer pLVar6;
  pointer plVar7;
  pointer plVar8;
  pointer ppLVar9;
  pointer ppLVar10;
  pointer pMVar11;
  pointer pMVar12;
  pointer pFVar13;
  pointer pFVar14;
  
  prune(this);
  if (this->_constdata != (uint8_t *)0x0) {
    operator_delete__(this->_constdata);
    this->_constdata = (uint8_t *)0x0;
  }
  pFVar1 = (this->_faceinfo).
           super__Vector_base<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pFVar2 = (this->_faceinfo).
           super__Vector_base<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->_faceinfo).super__Vector_base<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_faceinfo).super__Vector_base<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_faceinfo).super__Vector_base<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pFVar1 != (pointer)0x0) {
    operator_delete(pFVar1,(long)pFVar2 - (long)pFVar1);
  }
  puVar3 = (this->_rfaceids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar4 = (this->_rfaceids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage;
  (this->_rfaceids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_rfaceids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_rfaceids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)puVar4 - (long)puVar3);
  }
  pLVar5 = (this->_levelinfo).
           super__Vector_base<Ptex::v2_4::LevelInfo,_std::allocator<Ptex::v2_4::LevelInfo>_>._M_impl
           .super__Vector_impl_data._M_start;
  pLVar6 = (this->_levelinfo).
           super__Vector_base<Ptex::v2_4::LevelInfo,_std::allocator<Ptex::v2_4::LevelInfo>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage;
  (this->_levelinfo).
  super__Vector_base<Ptex::v2_4::LevelInfo,_std::allocator<Ptex::v2_4::LevelInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_levelinfo).
  super__Vector_base<Ptex::v2_4::LevelInfo,_std::allocator<Ptex::v2_4::LevelInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_levelinfo).
  super__Vector_base<Ptex::v2_4::LevelInfo,_std::allocator<Ptex::v2_4::LevelInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pLVar5 != (pointer)0x0) {
    operator_delete(pLVar5,(long)pLVar6 - (long)pLVar5);
  }
  plVar7 = (this->_levelpos).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  plVar8 = (this->_levelpos).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->_levelpos).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->_levelpos).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->_levelpos).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (plVar7 != (pointer)0x0) {
    operator_delete(plVar7,(long)plVar8 - (long)plVar7);
  }
  ppLVar9 = (this->_levels).
            super__Vector_base<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppLVar10 = (this->_levels).
             super__Vector_base<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->_levels).
  super__Vector_base<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_levels).
  super__Vector_base<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_levels).
  super__Vector_base<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (ppLVar9 != (pointer)0x0) {
    operator_delete(ppLVar9,(long)ppLVar10 - (long)ppLVar9);
  }
  pMVar11 = (this->_metaedits).
            super__Vector_base<Ptex::v2_4::PtexReader::MetaEdit,_std::allocator<Ptex::v2_4::PtexReader::MetaEdit>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pMVar12 = (this->_metaedits).
            super__Vector_base<Ptex::v2_4::PtexReader::MetaEdit,_std::allocator<Ptex::v2_4::PtexReader::MetaEdit>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->_metaedits).
  super__Vector_base<Ptex::v2_4::PtexReader::MetaEdit,_std::allocator<Ptex::v2_4::PtexReader::MetaEdit>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_metaedits).
  super__Vector_base<Ptex::v2_4::PtexReader::MetaEdit,_std::allocator<Ptex::v2_4::PtexReader::MetaEdit>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_metaedits).
  super__Vector_base<Ptex::v2_4::PtexReader::MetaEdit,_std::allocator<Ptex::v2_4::PtexReader::MetaEdit>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pMVar11 != (pointer)0x0) {
    operator_delete(pMVar11,(long)pMVar12 - (long)pMVar11);
  }
  pFVar13 = (this->_faceedits).
            super__Vector_base<Ptex::v2_4::PtexReader::FaceEdit,_std::allocator<Ptex::v2_4::PtexReader::FaceEdit>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pFVar14 = (this->_faceedits).
            super__Vector_base<Ptex::v2_4::PtexReader::FaceEdit,_std::allocator<Ptex::v2_4::PtexReader::FaceEdit>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->_faceedits).
  super__Vector_base<Ptex::v2_4::PtexReader::FaceEdit,_std::allocator<Ptex::v2_4::PtexReader::FaceEdit>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_faceedits).
  super__Vector_base<Ptex::v2_4::PtexReader::FaceEdit,_std::allocator<Ptex::v2_4::PtexReader::FaceEdit>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_faceedits).
  super__Vector_base<Ptex::v2_4::PtexReader::FaceEdit,_std::allocator<Ptex::v2_4::PtexReader::FaceEdit>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pFVar13 != (pointer)0x0) {
    operator_delete(pFVar13,(long)pFVar14 - (long)pFVar13);
  }
  closeFP(this);
  this->_ok = true;
  this->_needToOpen = true;
  this->_pendingPurge = false;
  this->_baseMemUsed = 0x2c8;
  this->_memUsed = 0x2c8;
  return;
}

Assistant:

void PtexReader::purge()
{
    // free all dynamic data
    prune();
    if (_constdata) {delete [] _constdata; _constdata = 0; }
    std::vector<FaceInfo>().swap(_faceinfo);
    std::vector<uint32_t>().swap(_rfaceids);
    std::vector<LevelInfo>().swap(_levelinfo);
    std::vector<FilePos>().swap(_levelpos);
    std::vector<Level*>().swap(_levels);
    std::vector<MetaEdit>().swap(_metaedits);
    std::vector<FaceEdit>().swap(_faceedits);
    closeFP();

    // reset initial state
    _ok = true;
    _needToOpen = true;
    _pendingPurge = false;
    _memUsed = _baseMemUsed = sizeof(*this);
}